

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall
QTableViewPrivate::drawAndClipSpans
          (QTableViewPrivate *this,QRegion *area,QPainter *painter,QStyleOptionViewItem *option,
          QBitArray *drawn,int firstVisualRow,int lastVisualRow,int firstVisualColumn,
          int lastVisualColumn)

{
  long lVar1;
  QWidget *this_00;
  Data<QHashPrivate::Node<QSpanCollection::Span_*,_QHashDummyValue>_> *pDVar2;
  Span *pSVar3;
  Span *span_00;
  QAbstractItemModel *pQVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  QStyleOptionViewItem *pQVar11;
  int iVar12;
  long in_FS_OFFSET;
  QRect QVar13;
  int local_198;
  QRegion local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 *local_148;
  undefined1 *puStack_140;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_138;
  Span *span;
  size_t local_120;
  QHash<QSpanCollection::Span_*,_QHashDummyValue> local_118;
  QRegion region;
  QStyleOptionViewItem opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  region.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_16_ =
       QWidget::rect((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                     viewport);
  QRegion::QRegion(&region,(QRect *)&opt,Rectangle);
  local_118.d = (Data *)0x0;
  bVar5 = QHeaderView::sectionsMoved(this->verticalHeader);
  if (!bVar5) {
    bVar5 = QHeaderView::sectionsMoved(this->horizontalHeader);
    if (!bVar5) {
      iVar7 = logicalColumn(this,firstVisualColumn);
      iVar8 = logicalRow(this,firstVisualRow);
      local_198 = (lastVisualColumn - firstVisualColumn) + 1;
      QSpanCollection::spansInRect((QSpanCollection *)&opt,(int)this + 0x650,iVar7,iVar8,local_198);
      QHash<QSpanCollection::Span_*,_QHashDummyValue>::operator=
                (&local_118,(QHash<QSpanCollection::Span_*,_QHashDummyValue> *)&opt);
      QHash<QSpanCollection::Span_*,_QHashDummyValue>::~QHash
                ((QHash<QSpanCollection::Span_*,_QHashDummyValue> *)&opt);
      goto LAB_00528e70;
    }
  }
  opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::list
            ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)&opt,
             &(this->spans).spans);
  pQVar11 = &opt;
  while (pQVar11 = *(QStyleOptionViewItem **)&pQVar11->super_QStyleOption, pQVar11 != &opt) {
    pDVar2 = *(Data<QHashPrivate::Node<QSpanCollection::Span_*,_QHashDummyValue>_> **)
              &(pQVar11->super_QStyleOption).rect;
    span = (Span *)pDVar2;
    iVar7 = visualColumn(this,*(int *)&pDVar2->field_0x4);
    iVar8 = visualRow(this,span->m_top);
    if (((iVar8 <= lastVisualRow) && (iVar7 <= lastVisualColumn)) &&
       ((firstVisualColumn < ((iVar7 + span->m_right) - span->m_left) + 1 &&
        (firstVisualRow < ((iVar8 + span->m_bottom) - span->m_top) + 1)))) {
      QSet<QSpanCollection::Span_*>::insert
                ((QSet<QSpanCollection::Span_*> *)&local_148,(Span **)&local_118);
    }
  }
  std::__cxx11::_List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
  _M_clear((_List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)&opt);
  local_198 = (lastVisualColumn - firstVisualColumn) + 1;
LAB_00528e70:
  _span = (piter)QHash<QSpanCollection::Span_*,_QHashDummyValue>::begin(&local_118);
  while( true ) {
    if (span == (Data<QHashPrivate::Node<QSpanCollection::Span_*,_QHashDummyValue>_> *)0x0 &&
        span._8_8_ == 0) break;
    pSVar3 = span->spans;
    uVar10 = span._8_8_ >> 7;
    span_00 = *(Span **)pSVar3[uVar10].entries[pSVar3[uVar10].offsets[span._8_4_ & 0x7f]].storage.
                        data;
    iVar7 = span_00->m_top;
    iVar8 = span_00->m_left;
    local_138.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_148 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = (this->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&opt,&(this->super_QAbstractItemViewPrivate).root);
    (**(code **)(*(long *)pQVar4 + 0x60))(&local_148,pQVar4,iVar7,iVar8,&opt);
    if (((-1 < (int)local_148) && (-1 < (long)local_148)) &&
       (local_138.ptr != (QAbstractItemModel *)0x0)) {
      local_158 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_150 = &DAT_aaaaaaaaaaaaaaaa;
      QVar13 = visualSpanRect(this,span_00);
      iVar8 = (this->super_QAbstractItemViewPrivate).scrollDelayOffset.xp.m_i;
      iVar12 = (this->super_QAbstractItemViewPrivate).scrollDelayOffset.yp.m_i;
      local_158._4_4_ = QVar13.y1.m_i.m_i + iVar12;
      local_158._0_4_ = QVar13.x1.m_i.m_i + iVar8;
      uStack_150._4_4_ = QVar13.y2.m_i.m_i + iVar12;
      uStack_150._0_4_ = QVar13.x2.m_i.m_i + iVar8;
      cVar6 = QRegion::intersects((QRect *)area);
      if (cVar6 != '\0') {
        memset(&opt,0xaa,0xd0);
        QStyleOptionViewItem::QStyleOptionViewItem(&opt,option);
        opt.super_QStyleOption.rect.x1.m_i = local_158._0_4_;
        opt.super_QStyleOption.rect.y1.m_i = local_158._4_4_;
        opt.super_QStyleOption.rect.x2.m_i = uStack_150._0_4_;
        opt.super_QStyleOption.rect.y2.m_i = uStack_150._4_4_;
        if (((this->super_QAbstractItemViewPrivate).alternatingColors == true) &&
           ((span_00->m_top & 1) != 0)) {
          opt.features.super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
          super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
               (QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>)
               ((uint)opt.features.
                      super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                      super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i | 2);
        }
        else {
          opt.features.super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
          super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
               (QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>)
               ((uint)opt.features.
                      super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                      super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 0xfffffffd);
        }
        drawCell(this,painter,&opt,(QModelIndex *)&local_148);
        if (this->showGrid == true) {
          iVar8 = QHeaderView::visualIndex(this->horizontalHeader,iVar7);
          if (iVar8 == 0) {
            local_158._4_4_ = local_158._4_4_ + 1;
          }
          iVar7 = QHeaderView::visualIndex(this->verticalHeader,iVar7);
          if (iVar7 == 0) {
            bVar5 = QWidget::isLeftToRight(this_00);
            if (bVar5) {
              local_158._0_4_ = local_158._0_4_ + 1;
            }
            else {
              uStack_150._0_4_ = uStack_150._0_4_ + -1;
            }
          }
        }
        QRegion::QRegion(&local_160,(QRect *)&local_158,Rectangle);
        QRegion::operator-=(&region,&local_160);
        QRegion::~QRegion(&local_160);
        for (iVar7 = span_00->m_top; iVar7 <= span_00->m_bottom; iVar7 = iVar7 + 1) {
          iVar8 = visualRow(this,iVar7);
          if (iVar8 <= lastVisualRow && firstVisualRow <= iVar8) {
            for (iVar12 = span_00->m_left; iVar12 <= span_00->m_right; iVar12 = iVar12 + 1) {
              iVar9 = visualColumn(this,iVar12);
              if (iVar9 <= lastVisualColumn && firstVisualColumn <= iVar9) {
                QBitArray::setBit(drawn,(long)(iVar9 + ((iVar8 - firstVisualRow) * local_198 -
                                                       firstVisualColumn)));
              }
            }
          }
        }
        QStyleOptionViewItem::~QStyleOptionViewItem(&opt);
      }
    }
    QHashPrivate::iterator<QHashPrivate::Node<QSpanCollection::Span_*,_QHashDummyValue>_>::
    operator++((iterator<QHashPrivate::Node<QSpanCollection::Span_*,_QHashDummyValue>_> *)&span);
  }
  QPainter::setClipRegion((QRegion *)painter,(ClipOperation)&region);
  QHash<QSpanCollection::Span_*,_QHashDummyValue>::~QHash(&local_118);
  QRegion::~QRegion(&region);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableViewPrivate::drawAndClipSpans(const QRegion &area, QPainter *painter,
                                         const QStyleOptionViewItem &option, QBitArray *drawn,
                                         int firstVisualRow, int lastVisualRow, int firstVisualColumn, int lastVisualColumn)
{
    Q_Q(const QTableView);
    bool alternateBase = false;
    QRegion region = viewport->rect();

    QSet<QSpanCollection::Span *> visibleSpans;
    bool sectionMoved = verticalHeader->sectionsMoved() || horizontalHeader->sectionsMoved();

    if (!sectionMoved) {
        visibleSpans = spans.spansInRect(logicalColumn(firstVisualColumn), logicalRow(firstVisualRow),
                                         lastVisualColumn - firstVisualColumn + 1, lastVisualRow - firstVisualRow + 1);
    } else {
        // Any cell outside the viewport, on the top or left, can still end up visible inside the
        // viewport if is has a span. Calculating if a spanned cell overlaps with the viewport is
        // "easy" enough when the columns (or rows) in the view are aligned with the columns
        // in the model; In that case you know that if a column is outside the viewport on the
        // right, it cannot affect the drawing of the cells inside the viewport, even with a span.
        // And under that assumption, the spansInRect() function can be used (which is optimized
        // to only iterate the spans that are close to the viewport).
        // But when the view has rearranged the columns (or rows), this is no longer true. In that
        // case, even if a column, according to the model, is outside the viewport on the right, it
        // can still overlap with the viewport. This can happen if it was moved to the left of the
        // viewport and one of its cells has a span. In that case we need to take the theoretically
        // slower route and iterate through all the spans, and check if any of them overlaps with
        // the viewport.
        const auto spanList = spans.spans;
        for (QSpanCollection::Span *span : spanList) {
            const int spanVisualLeft = visualColumn(span->left());
            const int spanVisualTop = visualRow(span->top());
            const int spanVisualRight = spanVisualLeft + span->width() - 1;
            const int spanVisualBottom = spanVisualTop + span->height() - 1;
            if ((spanVisualLeft <= lastVisualColumn && spanVisualRight >= firstVisualColumn)
                    && (spanVisualTop <= lastVisualRow && spanVisualBottom >= firstVisualRow))
                visibleSpans.insert(span);
        }
    }

    for (QSpanCollection::Span *span : std::as_const(visibleSpans)) {
        int row = span->top();
        int col = span->left();
        QModelIndex index = model->index(row, col, root);
        if (!index.isValid())
            continue;
        QRect rect = visualSpanRect(*span);
        rect.translate(scrollDelayOffset);
        if (!area.intersects(rect))
            continue;
        QStyleOptionViewItem opt = option;
        opt.rect = rect;
        alternateBase = alternatingColors && (span->top() & 1);
        opt.features.setFlag(QStyleOptionViewItem::Alternate, alternateBase);
        drawCell(painter, opt, index);
        if (showGrid) {
            // adjust the clip rect to be able to paint the top & left grid lines
            // if the headers are not visible, see paintEvent()
            if (horizontalHeader->visualIndex(row) == 0)
                rect.setTop(rect.top() + 1);
            if (verticalHeader->visualIndex(row) == 0) {
                if (q->isLeftToRight())
                    rect.setLeft(rect.left() + 1);
                else
                    rect.setRight(rect.right() - 1);
            }
        }
        region -= rect;
        for (int r = span->top(); r <= span->bottom(); ++r) {
            const int vr = visualRow(r);
            if (vr < firstVisualRow || vr > lastVisualRow)
                continue;
            for (int c = span->left(); c <= span->right(); ++c) {
                const int vc = visualColumn(c);
                if (vc < firstVisualColumn  || vc > lastVisualColumn)
                    continue;
                drawn->setBit((vr - firstVisualRow) * (lastVisualColumn - firstVisualColumn + 1)
                             + vc - firstVisualColumn);
            }
        }

    }
    painter->setClipRegion(region);
}